

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

int GetWitnessCommitmentIndex(CBlock *block)

{
  pointer psVar1;
  element_type *peVar2;
  pointer pCVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  size_type *psVar8;
  long in_FS_OFFSET;
  
  psVar1 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 == (block->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar5 = -1;
  }
  else {
    peVar2 = (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar8 = (size_type *)((long)&pCVar3->scriptPubKey + 0x1c);
    uVar6 = 0xffffffffffffffff;
    for (uVar7 = 0; iVar5 = (int)uVar6,
        ((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pCVar3) / 0x28 != uVar7; uVar7 = uVar7 + 1)
    {
      if ((((0x42 < *psVar8) &&
           (pcVar4 = *(char **)&((CScriptBase *)(psVar8 + -7))->_union, *pcVar4 == 'j')) &&
          (pcVar4[1] == '$')) &&
         (((pcVar4[2] == -0x56 && (pcVar4[3] == '!')) &&
          ((pcVar4[4] == -0x57 && (uVar6 = uVar6 & 0xffffffff, pcVar4[5] == -0x13)))))) {
        uVar6 = uVar7 & 0xffffffff;
      }
      psVar8 = psVar8 + 10;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

inline int GetWitnessCommitmentIndex(const CBlock& block)
{
    int commitpos = NO_WITNESS_COMMITMENT;
    if (!block.vtx.empty()) {
        for (size_t o = 0; o < block.vtx[0]->vout.size(); o++) {
            const CTxOut& vout = block.vtx[0]->vout[o];
            if (vout.scriptPubKey.size() >= MINIMUM_WITNESS_COMMITMENT &&
                vout.scriptPubKey[0] == OP_RETURN &&
                vout.scriptPubKey[1] == 0x24 &&
                vout.scriptPubKey[2] == 0xaa &&
                vout.scriptPubKey[3] == 0x21 &&
                vout.scriptPubKey[4] == 0xa9 &&
                vout.scriptPubKey[5] == 0xed) {
                commitpos = o;
            }
        }
    }
    return commitpos;
}